

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O2

bool __thiscall cmOrderDirectories::IsSameDirectory(cmOrderDirectories *this,string *l,string *r)

{
  __type _Var1;
  string *__lhs;
  string *__rhs;
  
  __lhs = GetRealPath(this,l);
  __rhs = GetRealPath(this,r);
  _Var1 = std::operator==(__lhs,__rhs);
  return _Var1;
}

Assistant:

bool cmOrderDirectories::IsSameDirectory(std::string const& l,
                                         std::string const& r)
{
  return this->GetRealPath(l) == this->GetRealPath(r);
}